

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

void scalar_compress(scalar *s,int bits)

{
  uint16_t uVar1;
  int local_18;
  int i;
  int bits_local;
  scalar *s_local;
  
  for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
    uVar1 = compress(s->c[local_18],bits);
    s->c[local_18] = uVar1;
  }
  return;
}

Assistant:

static void scalar_compress(scalar *s, int bits) {
  for (int i = 0; i < DEGREE; i++) {
    s->c[i] = compress(s->c[i], bits);
  }
}